

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerBase.cpp
# Opt level: O0

void __thiscall
helics::BrokerBase::loadInfoFromToml(BrokerBase *this,string *tomlString,bool runArgParser)

{
  bool bVar1;
  element_type *this_00;
  element_type *this_01;
  size_type sVar2;
  byte in_DL;
  string *in_RSI;
  basic_value<toml::type_config> *in_RDI;
  shared_ptr<helics::helicsCLI11App> sVar3;
  Error *e;
  ifstream file;
  istringstream tstring;
  shared_ptr<helics::HelicsConfigJSON> dptr;
  shared_ptr<helics::helicsCLI11App> sApp;
  shared_ptr<helics::helicsCLI11App> app;
  invalid_argument *iarg;
  value doc;
  BrokerBase *in_stack_00000bf8;
  App *in_stack_fffffffffffffa18;
  element_type *in_stack_fffffffffffffa20;
  shared_ptr<CLI::ConfigBase> *__r;
  basic_value<toml::type_config> *in_stack_fffffffffffffa30;
  size_type in_stack_fffffffffffffa50;
  undefined1 local_5a8 [7];
  char in_stack_fffffffffffffa5f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa60;
  App_p *in_stack_fffffffffffffab8;
  App *in_stack_fffffffffffffac0;
  istringstream local_3a0 [120];
  string *in_stack_fffffffffffffcd8;
  __shared_ptr local_210 [16];
  shared_ptr<CLI::ConfigBase> local_200;
  undefined1 local_1f0 [479];
  byte local_11;
  string *local_10;
  
  local_11 = in_DL & 1;
  local_10 = in_RSI;
  toml::basic_value<toml::type_config>::basic_value
            ((basic_value<toml::type_config> *)in_stack_fffffffffffffa20);
  fileops::loadToml(in_stack_fffffffffffffcd8);
  toml::basic_value<toml::type_config>::operator=(in_RDI,in_stack_fffffffffffffa30);
  toml::basic_value<toml::type_config>::~basic_value
            ((basic_value<toml::type_config> *)in_stack_fffffffffffffa20);
  if ((local_11 & 1) != 0) {
    sVar3 = generateBaseCLI(in_stack_00000bf8);
    (**(code **)(*(long *)in_RDI + 0x40))
              (local_1f0,in_RDI,
               sVar3.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._M_pi);
    in_stack_fffffffffffffa20 =
         CLI::std::
         __shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)0x44745a);
    __r = &local_200;
    std::shared_ptr<CLI::App>::shared_ptr<helics::helicsCLI11App,void>
              ((shared_ptr<CLI::App> *)in_stack_fffffffffffffa20,
               (shared_ptr<helics::helicsCLI11App> *)in_stack_fffffffffffffa18);
    CLI::App::add_subcommand(in_stack_fffffffffffffac0,in_stack_fffffffffffffab8);
    CLI::std::shared_ptr<CLI::App>::~shared_ptr((shared_ptr<CLI::App> *)0x447497);
    this_00 = CLI::std::
              __shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x4474a4);
    CLI::App::allow_extras(&this_00->super_App,true);
    CLI::std::__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x4474c0);
    CLI::App::get_config_formatter_base(in_stack_fffffffffffffa18);
    std::static_pointer_cast<helics::HelicsConfigJSON,CLI::ConfigBase>(__r);
    CLI::std::shared_ptr<CLI::ConfigBase>::~shared_ptr((shared_ptr<CLI::ConfigBase> *)0x4474f4);
    bVar1 = std::__shared_ptr::operator_cast_to_bool(local_210);
    if (bVar1) {
      this_01 = CLI::std::
                __shared_ptr_access<helics::HelicsConfigJSON,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<helics::HelicsConfigJSON,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x447517);
      HelicsConfigJSON::skipJson(this_01,true);
    }
    sVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            find(in_stack_fffffffffffffa60,in_stack_fffffffffffffa5f,in_stack_fffffffffffffa50);
    if (sVar2 == 0xffffffffffffffff) {
      std::ifstream::ifstream(local_5a8,local_10,_S_in);
      CLI::std::
      __shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x447684);
      CLI::App::parse_from_stream
                (&in_stack_fffffffffffffa20->super_App,(istream *)in_stack_fffffffffffffa18);
      std::ifstream::~ifstream(local_5a8);
    }
    else {
      std::__cxx11::istringstream::istringstream(local_3a0,local_10,_S_in);
      CLI::std::
      __shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x4475fe);
      CLI::App::parse_from_stream
                (&in_stack_fffffffffffffa20->super_App,(istream *)in_stack_fffffffffffffa18);
      std::__cxx11::istringstream::~istringstream(local_3a0);
    }
    CLI::std::shared_ptr<helics::HelicsConfigJSON>::~shared_ptr
              ((shared_ptr<helics::HelicsConfigJSON> *)0x44776a);
    CLI::std::shared_ptr<helics::helicsCLI11App>::~shared_ptr
              ((shared_ptr<helics::helicsCLI11App> *)0x447777);
    CLI::std::shared_ptr<helics::helicsCLI11App>::~shared_ptr
              ((shared_ptr<helics::helicsCLI11App> *)0x447784);
  }
  toml::basic_value<toml::type_config>::~basic_value
            ((basic_value<toml::type_config> *)in_stack_fffffffffffffa20);
  return;
}

Assistant:

void BrokerBase::loadInfoFromToml(const std::string& tomlString, bool runArgParser)
{
    toml::value doc;
    try {
        doc = fileops::loadToml(tomlString);
    }
    catch (const std::invalid_argument& iarg) {
        throw(helics::InvalidParameter(iarg.what()));
    }

    if (runArgParser) {
        auto app = generateBaseCLI();
        auto sApp = generateCLI();
        app->add_subcommand(sApp);
        app->allow_extras();
        auto dptr = std::static_pointer_cast<HelicsConfigJSON>(app->get_config_formatter_base());
        if (dptr) {
            dptr->skipJson(true);
        }
        try {
            if (tomlString.find('=') != std::string::npos) {
                std::istringstream tstring(tomlString);
                app->parse_from_stream(tstring);
            } else {
                std::ifstream file(tomlString);
                app->parse_from_stream(file);
            }
        }
        catch (const CLI::Error& e) {
            throw(InvalidIdentifier(e.what()));
        }
    }
}